

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

void __thiscall IF97::BaseRegion::~BaseRegion(BaseRegion *this)

{
  BaseRegion *this_local;
  
  this->_vptr_BaseRegion = (_func_int **)&PTR_cvmass_00136d48;
  std::vector<double,_std::allocator<double>_>::~vector(&this->lamnr);
  std::vector<int,_std::allocator<int>_>::~vector(&this->lamJr);
  std::vector<int,_std::allocator<int>_>::~vector(&this->lamIr);
  std::vector<double,_std::allocator<double>_>::~vector(&this->lamn0);
  std::vector<int,_std::allocator<int>_>::~vector(&this->lamJ0);
  std::vector<double,_std::allocator<double>_>::~vector(&this->munr);
  std::vector<int,_std::allocator<int>_>::~vector(&this->muJr);
  std::vector<int,_std::allocator<int>_>::~vector(&this->muIr);
  std::vector<double,_std::allocator<double>_>::~vector(&this->mun0);
  std::vector<int,_std::allocator<int>_>::~vector(&this->muJ0);
  std::vector<double,_std::allocator<double>_>::~vector(&this->n0);
  std::vector<int,_std::allocator<int>_>::~vector(&this->J0);
  std::vector<double,_std::allocator<double>_>::~vector(&this->nr);
  std::vector<int,_std::allocator<int>_>::~vector(&this->Jr);
  std::vector<int,_std::allocator<int>_>::~vector(&this->Ir);
  return;
}

Assistant:

BaseRegion(std::vector<RegionResidualElement> resid, std::vector<RegionIdealElement> ideal) : R(Rgas){
            for (std::size_t i = 0; i < resid.size(); ++i){
                nr.push_back(resid[i].n);
                Ir.push_back(resid[i].I);
                Jr.push_back(resid[i].J);
            }
            for (std::size_t i = 0; i < ideal.size(); ++i){
                n0.push_back(ideal[i].n);
                J0.push_back(ideal[i].J);
            }
            for (std::size_t i = 0; i < Hrdata.size(); ++i){
                munr.push_back(Hrdata[i].n);
                muIr.push_back(Hrdata[i].I);
                muJr.push_back(Hrdata[i].J);
            }
            for (std::size_t i = 0; i < H0data.size(); ++i){
                mun0.push_back(H0data[i].n);
                muJ0.push_back(H0data[i].J);
            }
            for (std::size_t i = 0; i < Lrdata.size(); ++i){
                lamnr.push_back(Lrdata[i].n);
                lamIr.push_back(Lrdata[i].I);
                lamJr.push_back(Lrdata[i].J);
            }
            for (std::size_t i = 0; i < L0data.size(); ++i){
                lamn0.push_back(L0data[i].n);
                lamJ0.push_back(L0data[i].J);
            }
        }